

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

CommandBufferTypes __thiscall
de::Random::
choose<vkt::(anonymous_namespace)::TestConfig::CommandBufferTypes,vkt::(anonymous_namespace)::TestConfig::CommandBufferTypes_const*>
          (Random *this,CommandBufferTypes *first,CommandBufferTypes *last)

{
  int iVar1;
  CommandBufferTypes CVar2;
  int ndx;
  int max;
  
  CVar2 = 0;
  max = 0;
  do {
    if (first == last) {
      return CVar2;
    }
    if (max < 1) {
LAB_0042e05d:
      CVar2 = *first;
    }
    else {
      iVar1 = getInt(this,0,max);
      if (iVar1 < 1) goto LAB_0042e05d;
    }
    first = first + 1;
    max = max + 1;
  } while( true );
}

Assistant:

T Random::choose (InputIter first, InputIter last)
{
	T val = T();
	DE_ASSERT(first != last);
	choose(first, last, &val, 1);
	return val;
}